

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.cc
# Opt level: O2

size_t readto(io_buf *i,char **pointer,char terminal)

{
  int *piVar1;
  char *pcVar2;
  char *pcVar3;
  ssize_t sVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
LAB_001198d1:
  do {
    pcVar2 = i->head;
    lVar7 = -(long)pcVar2;
    while( true ) {
      *pointer = pcVar2;
      pcVar3 = (i->space)._end;
      if ((pcVar3 <= pcVar2) || (*pcVar2 == terminal)) break;
      pcVar2 = pcVar2 + 1;
      lVar7 = lVar7 + -1;
    }
    if (pcVar2 != pcVar3) {
      pcVar3 = i->head;
      i->head = pcVar2 + 1;
      *pointer = *pointer + (long)(pcVar3 + lVar7);
      return 1 - (long)(pcVar3 + lVar7);
    }
    if (pcVar2 == (i->space).end_array) {
      pcVar2 = i->head;
      memmove((i->space)._begin,pcVar2,-(long)(pcVar2 + lVar7));
      pcVar3 = (i->space)._begin;
      i->head = pcVar3;
      pcVar3 = pcVar3 + (-lVar7 - (long)pcVar2);
      (i->space)._end = pcVar3;
      *pointer = pcVar3;
    }
    uVar5 = i->current;
    piVar1 = (i->files)._begin;
    uVar6 = (long)(i->files)._end - (long)piVar1 >> 2;
    if (uVar5 < uVar6) {
      sVar4 = io_buf::fill(i,piVar1[uVar5]);
      if (0 < sVar4) goto LAB_001198d1;
      uVar5 = i->current;
      uVar6 = (long)(i->files)._end - (long)(i->files)._begin >> 2;
    }
    i->current = uVar5 + 1;
    if (uVar6 <= uVar5 + 1) {
      pcVar2 = *pointer;
      pcVar3 = i->head;
      i->head = pcVar2;
      *pointer = pcVar3;
      return (long)pcVar2 - (long)pcVar3;
    }
  } while( true );
}

Assistant:

size_t readto(io_buf& i, char*& pointer, char terminal)
{
  // Return a pointer to the bytes before the terminal.  Must be less than the buffer size.
  pointer = i.head;
  while (pointer < i.space.end() && *pointer != terminal) pointer++;
  if (pointer != i.space.end())
  {
    size_t n = pointer - i.head;
    i.head = pointer + 1;
    pointer -= n;
    return n + 1;
  }
  else
  {
    if (i.space.end() == i.space.end_array)
    {
      size_t left = i.space.end() - i.head;
      memmove(i.space.begin(), i.head, left);
      i.head = i.space.begin();
      i.space.end() = i.space.begin() + left;
      pointer = i.space.end();
    }
    if (i.current < i.files.size() && i.fill(i.files[i.current]) > 0)  // more bytes are read.
      return readto(i, pointer, terminal);
    else if (++i.current < i.files.size())  // no more bytes, so go to next file.
      return readto(i, pointer, terminal);
    else  // no more bytes to read, return everything we have.
    {
      size_t n = pointer - i.head;
      i.head = pointer;
      pointer -= n;
      return n;
    }
  }
}